

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O0

int32_t mtmd_helper_eval(mtmd_context *ctx,llama_context *lctx,mtmd_input_chunks *chunks,
                        llama_pos pos0,llama_seq_id seq_id,int32_t n_batch)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  reference pmVar5;
  reference pvVar6;
  size_type sVar7;
  mtmd_image_tokens *pmVar8;
  reference pvVar9;
  long lVar10;
  size_t sVar11;
  uint *puVar12;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  int64_t t1;
  decode_embd_batch batch_img;
  float *embd_batch;
  int32_t n_tokens_batch;
  int32_t pos_offset;
  float *embd;
  int32_t n_img_batches;
  int32_t i_batch;
  int32_t n_tokens;
  int64_t t0;
  size_t i;
  bool is_last;
  mtmd_input_chunk *chunk;
  iterator __end1;
  iterator __begin1;
  mtmd_input_chunks *__range1;
  int n_mmproj_embd;
  llama_batch text_batch;
  llama_pos n_past;
  int32_t ret;
  int in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  clip_ctx *in_stack_fffffffffffffcc8;
  mtmd_image_tokens *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  mtmd_image_tokens *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  int iVar13;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  int local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  int local_17c;
  uint local_178;
  int local_174;
  float *local_170;
  uint local_164;
  int local_160;
  int local_15c;
  undefined1 local_158 [56];
  long local_120;
  undefined1 local_118 [56];
  int local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  mtmd_image_tokens *local_a8;
  byte local_99;
  reference local_98;
  mtmd_input_chunk *local_90;
  __normal_iterator<mtmd_input_chunk_*,_std::vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>_>
  local_88;
  undefined8 local_80;
  int local_74;
  int local_70;
  undefined4 uStack_6c;
  long lStack_68;
  long lStack_58;
  long local_50;
  long lStack_48;
  long local_40;
  int local_34;
  int32_t local_30;
  int local_2c;
  undefined4 local_28;
  undefined8 local_20;
  undefined8 local_18;
  long local_10;
  int32_t local_4;
  
  local_34 = in_ECX;
  local_2c = in_R9D;
  local_28 = in_R8D;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  llama_batch_init(&local_70,in_R9D,0,1);
  local_74 = clip_n_mmproj_embd(in_stack_fffffffffffffcc8);
  local_80 = local_20;
  local_88._M_current =
       (mtmd_input_chunk *)
       std::vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>::begin
                 ((vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_> *)
                  CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  local_90 = (mtmd_input_chunk *)
             std::vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>::end
                       ((vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_> *)
                        CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  local_288 = in_stack_fffffffffffffc68;
  uStack_284 = in_stack_fffffffffffffc6c;
  uStack_2c0 = in_stack_fffffffffffffc70;
  uStack_2bc = in_stack_fffffffffffffc74;
  do {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<mtmd_input_chunk_*,_std::vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>_>
                        *)CONCAT44(uStack_2bc,uStack_2c0),
                       (__normal_iterator<mtmd_input_chunk_*,_std::vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>_>
                        *)CONCAT44(uStack_284,local_288));
    if (!bVar3) {
      memcpy(&stack0xfffffffffffffcf8,&local_70,0x38);
      llama_batch_free();
      return 0;
    }
    pmVar5 = __gnu_cxx::
             __normal_iterator<mtmd_input_chunk_*,_std::vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>_>
             ::operator*(&local_88);
    local_98 = pmVar5;
    pvVar6 = std::vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>::back
                       ((vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_> *)
                        CONCAT44(uStack_2bc,uStack_2c0));
    local_99 = pmVar5 == pvVar6;
    if (local_98->type == MTMD_INPUT_CHUNK_TYPE_TEXT) {
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&local_98->tokens_text);
      local_70 = (int)sVar7;
      local_a8 = (mtmd_image_tokens *)0x0;
      while (in_stack_fffffffffffffce8 = local_a8,
            pmVar8 = (mtmd_image_tokens *)
                     std::vector<int,_std::allocator<int>_>::size(&local_98->tokens_text),
            in_stack_fffffffffffffce8 < pmVar8) {
        while( true ) {
          in_stack_fffffffffffffcd8 = local_a8;
          pmVar8 = (mtmd_image_tokens *)
                   std::vector<int,_std::allocator<int>_>::size(&local_98->tokens_text);
          uVar2 = local_18;
          in_stack_fffffffffffffce7 = in_stack_fffffffffffffcd8 < pmVar8 && local_70 < local_2c;
          if (in_stack_fffffffffffffcd8 >= pmVar8 || local_70 >= local_2c) break;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_98->tokens_text,(size_type)local_a8);
          *(value_type *)(lStack_68 + (long)local_a8 * 4) = *pvVar9;
          *(int *)(lStack_58 + (long)local_a8 * 4) = local_34;
          *(undefined4 *)(local_50 + (long)local_a8 * 4) = 1;
          **(undefined4 **)(lStack_48 + (long)local_a8 * 8) = local_28;
          *(undefined1 *)((long)&local_a8->nx + local_40) = 0;
          local_a8 = (mtmd_image_tokens *)((long)&local_a8->nx + 1);
          local_34 = local_34 + 1;
        }
        if ((local_99 & 1) != 0) {
          *(undefined1 *)(local_40 + (local_70 + -1)) = 1;
        }
        memcpy(&local_e0,&local_70,0x38);
        local_288 = local_e0;
        uStack_284 = uStack_dc;
        uStack_2c0 = uStack_d8;
        uStack_2bc = uStack_d4;
        local_30 = llama_decode(uVar2);
        if (local_30 != 0) {
          if ((int)g_logger_state.verbosity_thold < 5) {
            clip_log_internal(GGML_LOG_LEVEL_ERROR,"failed to decode text\n");
          }
          memcpy(local_118,&local_70,0x38);
          llama_batch_free();
          return local_30;
        }
        local_30 = 0;
      }
    }
    else if (local_98->type == MTMD_INPUT_CHUNK_TYPE_IMAGE) {
      if ((bool)local_99) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                   ,0x1fc,"GGML_ASSERT(%s) failed",
                   "!is_last && \"logits for last image chunk is not yet support\"");
      }
      bVar3 = std::operator!=((unique_ptr<mtmd_image_tokens,_mtmd_image_tokens_deleter> *)
                              CONCAT44(uStack_2bc,uStack_2c0),
                              (nullptr_t)CONCAT44(uStack_284,local_288));
      if (!bVar3) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                   ,0x1fd,"GGML_ASSERT(%s) failed","chunk.tokens_image != nullptr");
      }
      local_120 = ggml_time_ms();
      if (((*(byte *)(local_10 + 0x28) & 1) != 0) && ((int)g_logger_state.verbosity_thold < 3)) {
        clip_log_internal(GGML_LOG_LEVEL_INFO,"encoding image or slice...\n");
      }
      std::unique_ptr<mtmd_image_tokens,_mtmd_image_tokens_deleter>::get
                ((unique_ptr<mtmd_image_tokens,_mtmd_image_tokens_deleter> *)
                 CONCAT44(uStack_2bc,uStack_2c0));
      local_30 = mtmd_encode((mtmd_context *)
                             CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                             in_stack_fffffffffffffcd8);
      if (local_30 != 0) {
        if ((int)g_logger_state.verbosity_thold < 5) {
          clip_log_internal(GGML_LOG_LEVEL_ERROR,"failed to encode image\n");
        }
        memcpy(local_158,&local_70,0x38);
        llama_batch_free();
        return local_30;
      }
      if (((*(byte *)(local_10 + 0x28) & 1) != 0) && ((int)g_logger_state.verbosity_thold < 3)) {
        lVar10 = ggml_time_ms();
        clip_log_internal(GGML_LOG_LEVEL_INFO,"image/slice encoded in %ld ms\n",lVar10 - local_120);
      }
      std::unique_ptr<mtmd_image_tokens,_mtmd_image_tokens_deleter>::get
                ((unique_ptr<mtmd_image_tokens,_mtmd_image_tokens_deleter> *)
                 CONCAT44(uStack_2bc,uStack_2c0));
      sVar11 = mtmd_image_tokens_get_n_tokens((mtmd_image_tokens *)0x195d63);
      local_15c = (int)sVar11;
      local_160 = 0;
      local_164 = (int)((local_15c + local_2c) - 1U & (local_2c - 1U ^ 0xffffffff)) / local_2c;
      local_170 = mtmd_get_output_embd((mtmd_context *)0x195db1);
      bVar3 = mtmd_decode_use_non_causal((mtmd_context *)CONCAT44(uStack_284,local_288));
      if (bVar3) {
        llama_set_causal_attn(local_18,0);
      }
      while (local_160 < (int)local_164) {
        local_174 = local_160 * local_2c;
        local_17c = local_15c - local_174;
        puVar12 = (uint *)std::min<int>(&local_2c,&local_17c);
        local_178 = *puVar12;
        decode_embd_batch::decode_embd_batch
                  ((decode_embd_batch *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   (float *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                   (int32_t)((ulong)pmVar5 >> 0x20),(llama_pos)pmVar5,
                   (llama_seq_id)((ulong)in_stack_fffffffffffffce8 >> 0x20));
        printf("decoding image batch %d/%d, n_tokens_batch = %d\n",(ulong)(local_160 + 1),
               (ulong)local_164,(ulong)local_178);
        ggml_time_ms();
        local_288 = (int)local_1c0;
        uStack_284 = (undefined4)((ulong)local_1c0 >> 0x20);
        uStack_280 = (undefined4)uStack_1b8;
        uStack_27c = (undefined4)((ulong)uStack_1b8 >> 0x20);
        local_30 = llama_decode(local_18);
        uVar1 = local_164;
        if (local_30 == 0) {
          if (((*(byte *)(local_10 + 0x28) & 1) != 0) && ((int)g_logger_state.verbosity_thold < 3))
          {
            uVar4 = local_160 + 1;
            ggml_time_ms();
            clip_log_internal(GGML_LOG_LEVEL_INFO,"image decoded (batch %d/%d) in %ld ms\n",
                              (ulong)uVar4,(ulong)uVar1);
          }
          local_160 = local_160 + 1;
          local_34 = local_178 + local_34;
          iVar13 = 0;
          uStack_2c0 = uStack_280;
          uStack_2bc = uStack_27c;
        }
        else {
          if ((int)g_logger_state.verbosity_thold < 5) {
            clip_log_internal(GGML_LOG_LEVEL_ERROR,"failed to decode image\n");
          }
          llama_set_causal_attn(local_18,1);
          uStack_2c0 = (undefined4)lStack_68;
          uStack_2bc = (undefined4)((ulong)lStack_68 >> 0x20);
          local_288 = local_70;
          uStack_284 = uStack_6c;
          llama_batch_free();
          local_4 = local_30;
          iVar13 = 1;
        }
        decode_embd_batch::~decode_embd_batch((decode_embd_batch *)CONCAT44(uStack_2bc,uStack_2c0));
        if (iVar13 != 0) {
          return local_4;
        }
      }
      bVar3 = mtmd_decode_use_non_causal((mtmd_context *)CONCAT44(uStack_284,local_288));
      if (bVar3) {
        llama_set_causal_attn(local_18,1);
      }
    }
    else {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                 ,0x234,"GGML_ASSERT(%s) failed","false && \"chunk type not supported\"");
    }
    __gnu_cxx::
    __normal_iterator<mtmd_input_chunk_*,_std::vector<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>_>
    ::operator++(&local_88);
  } while( true );
}

Assistant:

int32_t mtmd_helper_eval(mtmd_context * ctx,
        llama_context * lctx,
        mtmd_input_chunks & chunks,
        llama_pos pos0,
        llama_seq_id seq_id,
        int32_t n_batch) {
    int32_t ret;
    llama_pos n_past = pos0;
    llama_batch text_batch = llama_batch_init(n_batch, 0, 1);
    int n_mmproj_embd = clip_n_mmproj_embd(ctx->ctx_clip);

    for (auto & chunk : chunks) {
        bool is_last = &chunk == &chunks.back();
        if (chunk.type == MTMD_INPUT_CHUNK_TYPE_TEXT) {
            text_batch.n_tokens = chunk.tokens_text.size();
            size_t i = 0;
            while (i < chunk.tokens_text.size()) { // split into batches
                for (; i < chunk.tokens_text.size() && text_batch.n_tokens < n_batch; i++) {
                    text_batch.token   [i]    = chunk.tokens_text[i];
                    text_batch.pos     [i]    = n_past++;
                    text_batch.n_seq_id[i]    = 1;
                    text_batch.seq_id  [i][0] = seq_id;
                    text_batch.logits  [i]    = false;
                }
                if (is_last) {
                    // always get logits for last input chunk
                    text_batch.logits[text_batch.n_tokens - 1] = true;
                }
                ret = llama_decode(lctx, text_batch);
                if (ret != 0) {
                    LOG_ERR("failed to decode text\n");
                    llama_batch_free(text_batch);
                    return ret;
                }
            }

        } else if (chunk.type == MTMD_INPUT_CHUNK_TYPE_IMAGE) {
            GGML_ASSERT(!is_last && "logits for last image chunk is not yet support");
            GGML_ASSERT(chunk.tokens_image != nullptr);
            int64_t t0 = ggml_time_ms();
            if (ctx->print_timings) {
                LOG_INF("encoding image or slice...\n");
            }
            ret = mtmd_encode(ctx, chunk.tokens_image.get());
            if (ret != 0) {
                LOG_ERR("failed to encode image\n");
                llama_batch_free(text_batch);
                return ret;
            }
            if (ctx->print_timings) {
                LOG_INF("image/slice encoded in %" PRId64 " ms\n", ggml_time_ms() - t0);
            }

            int32_t n_tokens = mtmd_image_tokens_get_n_tokens(chunk.tokens_image.get());
            int32_t i_batch = 0;
            int32_t n_img_batches = GGML_PAD(n_tokens, n_batch) / n_batch;
            float * embd = mtmd_get_output_embd(ctx);

            if (mtmd_decode_use_non_causal(ctx)) {
                llama_set_causal_attn(lctx, false);
                // TODO @ngxson : need to make sure only one image is processed at a time, and n_ubatch must be enough to hold the image
            }

            while (i_batch < n_img_batches) { // split into batches
                int32_t pos_offset = i_batch*n_batch;
                int32_t n_tokens_batch = std::min(n_batch, n_tokens - pos_offset);
                float * embd_batch = embd + pos_offset*n_mmproj_embd;
                decode_embd_batch batch_img(embd_batch, n_tokens_batch, n_past, 0);

                printf("decoding image batch %d/%d, n_tokens_batch = %d\n", i_batch+1, n_img_batches, n_tokens_batch);

                int64_t t1 = ggml_time_ms();
                ret = llama_decode(lctx, batch_img.batch);
                if (ret != 0) {
                    LOG_ERR("failed to decode image\n");
                    llama_set_causal_attn(lctx, true); // restore causal attn
                    llama_batch_free(text_batch);
                    return ret;
                }

                if (ctx->print_timings) {
                    LOG_INF("image decoded (batch %d/%d) in %" PRId64 " ms\n", i_batch+1, n_img_batches, ggml_time_ms() - t1);
                }

                i_batch++;
                n_past += n_tokens_batch;
            }

            if (mtmd_decode_use_non_causal(ctx)) {
                llama_set_causal_attn(lctx, true);
            }

        } else {
            GGML_ASSERT(false && "chunk type not supported");
        }
    }

    llama_batch_free(text_batch);
    return 0;
}